

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall kratos::FSM::output(FSM *this,string *var_name,shared_ptr<kratos::Var> *default_)

{
  undefined1 local_30 [8];
  shared_ptr<kratos::Var> var;
  
  Generator::get_var((Generator *)local_30,(string *)this->generator_);
  output(this,(shared_ptr<kratos::Var> *)local_30,default_);
  if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void FSM::output(const std::string& var_name, const std::shared_ptr<Var>& default_) {
    auto var = generator_->get_var(var_name);
    output(var, default_);
}